

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

ssize_t __thiscall
kj::anon_unknown_123::AsyncPipe::BlockedRead::write
          (BlockedRead *this,int __fd,void *__buf,size_t __n)

{
  AsyncPipe *pAVar1;
  PromiseArena *pPVar2;
  AsyncInputStream AVar3;
  AsyncOutputStream node;
  uint uVar4;
  void *pvVar5;
  uint uVar6;
  void *extraout_RDX;
  undefined4 in_register_00000034;
  BlockedRead *this_00;
  TransformPromiseNodeBase *this_01;
  undefined8 __return_storage_ptr__;
  PromiseArena *unaff_R15;
  bool bVar7;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> moreData;
  AsyncInputStream local_70;
  DebugExpression<bool> _kjCondition;
  undefined7 uStack_67;
  Fault f;
  anon_union_32_1_a8a2e026_for_OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>_2
  local_50;
  
  this_00 = (BlockedRead *)CONCAT44(in_register_00000034,__fd);
  bVar7 = (this_00->canceler).list.ptr == (AdapterBase *)0x0;
  _kjCondition.value = bVar7;
  if (!bVar7) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[16]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
               ,0x3c3,FAILED,"canceler.isEmpty()","_kjCondition,\"already pumping\"",&_kjCondition,
               (char (*) [16])"already pumping");
    kj::_::Debug::Fault::fatal(&f);
  }
  moreData.ptr = (ArrayPtr<const_unsigned_char> *)((long)__buf + 0x10);
  moreData.size_ = __n - 1;
  __return_storage_ptr__ = &f;
  writeImpl((OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>
             *)__return_storage_ptr__,this_00,*__buf,moreData);
  if ((int)f.exception == 2) {
    __return_storage_ptr__ = local_50._24_8_;
    uVar4 = 1;
  }
  else {
    uVar6 = (int)f.exception - 1;
    local_50._8_8_ = ZEXT48(uVar6);
    local_50._0_8_ = extraout_RDX;
    local_50._16_8_ = unaff_R15;
    uVar4 = 0;
    if (1 < uVar6) {
      uVar4 = uVar6;
    }
  }
  if (uVar4 == 1) {
    if (local_50._8_8_ != 0) {
      AsyncPipe::write((AsyncPipe *)&local_70,(int)this_00->pipe,(void *)local_50._0_8_,
                       local_50._8_8_);
      AVar3._vptr_AsyncInputStream = local_70._vptr_AsyncInputStream;
      if ((OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>
           *)__return_storage_ptr__ ==
          (OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>
           *)0x0) {
        (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
        _vptr_AsyncInputStream = local_70._vptr_AsyncInputStream;
        return (ssize_t)this;
      }
      pAVar1 = this_00->pipe;
      pPVar2 = (PromiseArena *)local_70._vptr_AsyncInputStream[1];
      if (pPVar2 == (PromiseArena *)0x0 ||
          (ulong)((long)local_70._vptr_AsyncInputStream - (long)pPVar2) < 0x38) {
        pvVar5 = operator_new(0x400);
        this_01 = (TransformPromiseNodeBase *)((long)pvVar5 + 0x3c8);
        kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                  (this_01,(OwnPromiseNode *)&local_70,
                   kj::_::
                   SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:990:35)>
                   ::anon_class_24_2_b6e2a7c2_for_func::operator());
        *(undefined ***)((long)pvVar5 + 0x3c8) = &PTR_destroy_00621c88;
        *(undefined8 *)((long)pvVar5 + 1000) = local_50._16_8_;
        *(undefined8 *)((long)pvVar5 + 0x3f0) = __return_storage_ptr__;
        *(AsyncPipe **)((long)pvVar5 + 0x3f8) = pAVar1;
        *(void **)((long)pvVar5 + 0x3d0) = pvVar5;
      }
      else {
        local_70._vptr_AsyncInputStream[1] = (_func_int *)0x0;
        this_01 = (TransformPromiseNodeBase *)(local_70._vptr_AsyncInputStream + -7);
        kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                  (this_01,(OwnPromiseNode *)&local_70,
                   kj::_::
                   SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:990:35)>
                   ::anon_class_24_2_b6e2a7c2_for_func::operator());
        AVar3._vptr_AsyncInputStream[-7] = (_func_int *)&PTR_destroy_00621c88;
        AVar3._vptr_AsyncInputStream[-3] = (_func_int *)local_50._16_8_;
        ((PromiseArenaMember *)(AVar3._vptr_AsyncInputStream + -2))->_vptr_PromiseArenaMember =
             (_func_int **)__return_storage_ptr__;
        AVar3._vptr_AsyncInputStream[-1] = (_func_int *)pAVar1;
        ((PromiseArenaMember *)(AVar3._vptr_AsyncInputStream + -6))->_vptr_PromiseArenaMember =
             (_func_int **)pPVar2;
      }
      f.exception = (Exception *)&DAT_0048a171;
      __kjCondition = (_func_int **)this_01;
      kj::_::PromiseDisposer::
      appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
                ((PromiseDisposer *)this,(OwnPromiseNode *)&_kjCondition,(SourceLocation *)&f);
      node._vptr_AsyncOutputStream = __kjCondition;
      if ((TransformPromiseNodeBase *)__kjCondition != (TransformPromiseNodeBase *)0x0) {
        __kjCondition = (_func_int **)0x0;
        kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node._vptr_AsyncOutputStream);
      }
      AVar3._vptr_AsyncInputStream = local_70._vptr_AsyncInputStream;
      if ((PromiseArenaMember *)local_70._vptr_AsyncInputStream == (PromiseArenaMember *)0x0) {
        return (ssize_t)this;
      }
      local_70._vptr_AsyncInputStream = (_func_int **)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)AVar3._vptr_AsyncInputStream);
      return (ssize_t)this;
    }
    if ((OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>
         *)__return_storage_ptr__ !=
        (OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>
         *)0x0) {
      AsyncPipe::write((AsyncPipe *)this,(int)this_00->pipe,(void *)local_50._16_8_,
                       __return_storage_ptr__);
      return (ssize_t)this;
    }
  }
  else if (uVar4 != 0) {
    kj::_::unreachable();
  }
  kj::_::readyNow();
  return (ssize_t)this;
}

Assistant:

TwoWayPipe newTwoWayPipe() {
  auto pipe1 = kj::refcounted<AsyncPipe>();
  auto pipe2 = kj::refcounted<AsyncPipe>();
  auto end1 = kj::heap<TwoWayPipeEnd>(kj::addRef(*pipe1), kj::addRef(*pipe2));
  auto end2 = kj::heap<TwoWayPipeEnd>(kj::mv(pipe2), kj::mv(pipe1));
  return { { kj::mv(end1), kj::mv(end2) } };
}